

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::PatternMatcher::PatternMatcher
          (PatternMatcher *this,string *designation,Module *module,Split *list)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  mapped_type *pmVar3;
  long lVar4;
  Function *pFVar5;
  ostream *poVar6;
  Split *pSVar7;
  char *extraout_RDX;
  pointer str;
  Name name;
  Name name_00;
  undefined1 local_208 [392];
  IString local_80;
  Module *local_70;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_68;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *local_60;
  string *local_58;
  undefined1 local_50 [8];
  Name escaped;
  
  pSVar7 = list;
  local_70 = module;
  local_58 = designation;
  std::__cxx11::string::string((string *)this,(string *)designation);
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60 = &this->names;
  p_Var1 = &(this->names)._M_t._M_impl.super__Rb_tree_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->patterns;
  p_Var1 = &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->patternsMatched)._M_t._M_impl.super__Rb_tree_header;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->patternsMatched)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unescaped)._M_t._M_impl.super__Rb_tree_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unescaped)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  str = (list->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (list->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (str == pbVar2) {
      return;
    }
    IString::IString(&local_80,str);
    name.super_IString.str._M_str = extraout_RDX;
    name.super_IString.str._M_len = (size_t)local_80.str._M_str;
    _local_50 = (string_view)WasmBinaryReader::escape((WasmBinaryReader *)local_80.str._M_len,name);
    IString::toString_abi_cxx11_((string *)local_208,(IString *)local_50);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->unescaped,(string *)local_208);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)local_208);
    lVar4 = std::__cxx11::string::find((char)str,0x2a);
    if (lVar4 == -1) {
      pFVar5 = Module::getFunctionOrNull(local_70,(Name)_local_50);
      if (pFVar5 == (Function *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"warning: Asyncify ");
        poVar6 = std::operator<<(poVar6,(string *)local_58);
        poVar6 = std::operator<<(poVar6,"list contained a non-existing function name: ");
        poVar6 = std::operator<<(poVar6,(string *)str);
        poVar6 = std::operator<<(poVar6," (");
        name_00.super_IString.str._M_str = (char *)pSVar7;
        name_00.super_IString.str._M_len = escaped.super_IString.str._M_len;
        poVar6 = wasm::operator<<((wasm *)poVar6,(ostream *)local_50,name_00);
        std::operator<<(poVar6,")\n");
      }
      else if ((pFVar5->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
        Fatal::Fatal((Fatal *)local_208);
        poVar6 = (ostream *)(local_208 + 0x10);
        std::operator<<(poVar6,"Asyncify ");
        std::operator<<(poVar6,(string *)local_58);
        std::operator<<(poVar6,
                        "list contained an imported function name (use the import list for imports): "
                       );
        std::operator<<(poVar6,(string *)str);
        escaped.super_IString.str._M_str._7_1_ = 10;
        Fatal::operator<<((Fatal *)local_208,(char *)((long)&escaped.super_IString.str._M_str + 7));
        Fatal::~Fatal((Fatal *)local_208);
      }
      Name::Name((Name *)local_208,_local_50);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_M_insert_unique<wasm::Name>(&local_60->_M_t,(Name *)local_208);
    }
    else {
      IString::toString_abi_cxx11_((string *)local_208,(IString *)local_50);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>(local_68,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
    }
    str = str + 1;
  } while( true );
}

Assistant:

PatternMatcher(std::string designation,
                 Module& module,
                 const String::Split& list)
    : designation(designation) {
    // The lists contain human-readable strings. Turn them into the
    // internal escaped names for later comparisons
    for (auto& name : list) {
      auto escaped = WasmBinaryReader::escape(name);
      unescaped[escaped.toString()] = name;
      if (name.find('*') != std::string::npos) {
        patterns.insert(escaped.toString());
      } else {
        auto* func = module.getFunctionOrNull(escaped);
        if (!func) {
          std::cerr << "warning: Asyncify " << designation
                    << "list contained a non-existing function name: " << name
                    << " (" << escaped << ")\n";
        } else if (func->imported()) {
          Fatal() << "Asyncify " << designation
                  << "list contained an imported function name (use the import "
                     "list for imports): "
                  << name << '\n';
        }
        names.insert(escaped.str);
      }
    }
  }